

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

void __thiscall
capnp::anon_unknown_1::CppTypeName::addMemberType(CppTypeName *this,StringPtr innerName)

{
  StringTree *this_00;
  StringPtr *in_R8;
  StringTree local_58;
  CppTypeName *local_20;
  CppTypeName *this_local;
  StringPtr innerName_local;
  
  innerName_local.content.ptr = (char *)innerName.content.size_;
  this_local = (CppTypeName *)innerName.content.ptr;
  local_20 = this;
  this_00 = kj::mv<kj::StringTree>(&this->name);
  kj::strTree<kj::StringTree,char_const(&)[3],kj::StringPtr&>
            (&local_58,(kj *)this_00,(StringTree *)0x4184d9,(char (*) [3])&this_local,in_R8);
  kj::StringTree::operator=(&this->name,&local_58);
  kj::StringTree::~StringTree(&local_58);
  this->needsTypename = (bool)(this->isArgDependent & 1);
  return;
}

Assistant:

void addMemberType(kj::StringPtr innerName) {
    // Append "::innerName" to refer to a member.

    name = kj::strTree(kj::mv(name), "::", innerName);
    needsTypename = isArgDependent;
  }